

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso.c
# Opt level: O1

void Gia_IsoTestOld(Gia_Man_t *p,int fVerbose)

{
  void **ppvVar1;
  void *__ptr;
  int iVar2;
  Vec_Ptr_t *__ptr_00;
  long lVar3;
  ulong uVar4;
  int level;
  long lVar5;
  timespec ts;
  timespec local_40;
  
  iVar2 = clock_gettime(3,&local_40);
  if (iVar2 < 0) {
    lVar3 = 1;
  }
  else {
    lVar3 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    lVar3 = ((lVar3 >> 7) - (lVar3 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  __ptr_00 = Gia_IsoDeriveEquivPos(p,0,fVerbose);
  if (__ptr_00 == (Vec_Ptr_t *)0x0) {
    uVar4 = 1;
  }
  else {
    uVar4 = (ulong)(uint)__ptr_00->nSize;
  }
  printf("Reduced %d outputs to %d.  ",(ulong)(uint)(p->vCos->nSize - p->nRegs),uVar4);
  level = 3;
  iVar2 = clock_gettime(3,&local_40);
  if (iVar2 < 0) {
    lVar5 = -1;
  }
  else {
    lVar5 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
  }
  Abc_Print(level,"%s =","Time");
  Abc_Print(level,"%9.2f sec\n",(double)(lVar5 + lVar3) / 1000000.0);
  if ((__ptr_00 != (Vec_Ptr_t *)0x0 && fVerbose != 0) &&
     (p->vCos->nSize - p->nRegs != __ptr_00->nSize)) {
    puts("Nontrivial classes:");
  }
  if (__ptr_00 != (Vec_Ptr_t *)0x0) {
    iVar2 = __ptr_00->nSize;
    if (0 < (long)iVar2) {
      ppvVar1 = __ptr_00->pArray;
      lVar3 = 0;
      do {
        __ptr = ppvVar1[lVar3];
        if (__ptr != (void *)0x0) {
          if (*(void **)((long)__ptr + 8) != (void *)0x0) {
            free(*(void **)((long)__ptr + 8));
            *(undefined8 *)((long)__ptr + 8) = 0;
          }
          free(__ptr);
        }
        lVar3 = lVar3 + 1;
      } while (iVar2 != lVar3);
    }
    if (__ptr_00->pArray != (void **)0x0) {
      free(__ptr_00->pArray);
      __ptr_00->pArray = (void **)0x0;
    }
    free(__ptr_00);
  }
  return;
}

Assistant:

void Gia_IsoTestOld( Gia_Man_t * p, int fVerbose )
{
    Vec_Ptr_t * vEquivs;
    abctime clk = Abc_Clock(); 
    vEquivs = Gia_IsoDeriveEquivPos( p, 0, fVerbose );
    printf( "Reduced %d outputs to %d.  ", Gia_ManPoNum(p), vEquivs ? Vec_PtrSize(vEquivs) : 1 );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    if ( fVerbose && vEquivs && Gia_ManPoNum(p) != Vec_PtrSize(vEquivs) )
    {
        printf( "Nontrivial classes:\n" );
//        Vec_VecPrintInt( (Vec_Vec_t *)vEquivs, 1 );
    }
    Vec_VecFreeP( (Vec_Vec_t **)&vEquivs );
}